

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O1

value * mjs::anon_unknown_46::json_parse_value(value *__return_storage_ptr__,json_lexer *lex)

{
  json_token_type jVar1;
  pointer pwVar2;
  gc_heap *pgVar3;
  uint uVar4;
  long *plVar5;
  uint32_t index;
  json_token *this;
  int iVar6;
  bool bVar7;
  double dVar8;
  object_ptr o;
  wstring key;
  json_token token;
  object_ptr a;
  undefined1 local_1a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_190;
  bool *local_180 [2];
  json_token local_170;
  undefined1 local_140 [8];
  _Alloc_hider local_138;
  gc_heap *local_130;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_128;
  size_t local_118;
  undefined1 local_110 [16];
  undefined1 local_100 [32];
  undefined1 local_e0 [24];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_c8;
  wstring_view local_b0;
  json_token local_a0;
  gc_heap_ptr_untyped local_70;
  json_token local_60;
  
  json_lexer::skip_whitespace(lex);
  local_140._0_4_ = (lex->tok_).type_;
  local_138._M_p = (pointer)&local_128;
  pwVar2 = (lex->tok_).text_._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&local_138,pwVar2,pwVar2 + (lex->tok_).text_._M_string_length);
  local_118 = (lex->tok_).pos_;
  json_lexer::next_token(&local_60,lex);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_60.text_._M_dataplus._M_p != &local_60.text_.field_2) {
    operator_delete(local_60.text_._M_dataplus._M_p,
                    local_60.text_.field_2._M_allocated_capacity * 4 + 4);
  }
  uVar4 = local_140._0_4_ - string;
  switch(uVar4) {
  case 0:
    if (1 < uVar4) {
LAB_0014345f:
      __assert_fail("type_ == json_token_type::string || type_ == json_token_type::number",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/json_object.cpp"
                    ,0x41,"const std::wstring &mjs::(anonymous namespace)::json_token::text() const"
                   );
    }
    local_a0._0_8_ = local_130;
    local_a0.text_._M_dataplus._M_p = local_138._M_p;
    string::string((string *)&local_170,(lex->global_).super_gc_heap_ptr_untyped.heap_,
                   (wstring_view *)&local_a0);
    __return_storage_ptr__->type_ = string;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = (gc_heap *)local_170._0_8_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 8) =
         local_170.text_._M_dataplus._M_p._0_4_;
    if ((gc_heap *)local_170._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_170._0_8_,
                      (gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
    this = &local_170;
    goto LAB_0014340e;
  case 1:
    if (1 < uVar4) goto LAB_0014345f;
    local_170._0_8_ = local_130;
    local_170.text_._M_dataplus._M_p = local_138._M_p;
    dVar8 = to_number((wstring_view *)&local_170);
    __return_storage_ptr__->type_ = number;
    (__return_storage_ptr__->field_1).n_ = dVar8;
    break;
  case 2:
    value::value(__return_storage_ptr__,(value *)value::null);
    break;
  case 3:
    __return_storage_ptr__->type_ = boolean;
    (__return_storage_ptr__->field_1).b_ = false;
    break;
  case 4:
    __return_storage_ptr__->type_ = boolean;
    (__return_storage_ptr__->field_1).b_ = true;
    break;
  case 5:
    uVar4 = 0;
    make_array((gc_heap_ptr<mjs::global_object> *)local_e0,(uint32_t)lex);
    pgVar3 = (lex->global_).super_gc_heap_ptr_untyped.heap_;
    local_1a8._16_8_ = __return_storage_ptr__;
    while( true ) {
      json_lexer::skip_whitespace(lex);
      jVar1 = (lex->tok_).type_;
      if (jVar1 == rbracket) break;
      if (uVar4 != 0) {
        if (jVar1 != comma) {
          json_lexer::throw_unexpected(lex);
        }
        json_lexer::next_token(&local_a0,lex);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_a0.text_._M_dataplus._M_p != &local_a0.text_.field_2) {
          operator_delete(local_a0.text_._M_dataplus._M_p,
                          local_a0.text_.field_2._M_allocated_capacity * 4 + 4);
        }
        json_lexer::skip_whitespace(lex);
      }
      plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_e0);
      index_string_abi_cxx11_((wstring *)local_110,(mjs *)(ulong)uVar4,index);
      local_1a8._0_8_ = local_110._8_8_;
      local_1a8._8_8_ = local_110._0_8_;
      string::string((string *)&local_190,pgVar3,(wstring_view *)local_1a8);
      json_parse_value((value *)&local_170,lex);
      (**(code **)(*plVar5 + 8))(plVar5,&local_190,&local_170,0);
      value::destroy((value *)&local_170);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
      if ((gc_heap *)local_110._0_8_ != (gc_heap *)(local_110 + 0x10)) {
        operator_delete((void *)local_110._0_8_,local_100._0_8_ * 4 + 4);
      }
      uVar4 = uVar4 + 1;
    }
    json_lexer::next_token(&local_170,lex);
    __return_storage_ptr__ = (value *)local_1a8._16_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_170.text_._M_dataplus._M_p != &local_170.text_.field_2) {
      operator_delete(local_170.text_._M_dataplus._M_p,
                      local_170.text_.field_2._M_allocated_capacity * 4 + 4);
    }
    *&__return_storage_ptr__->type_ = object;
    (((anon_union_32_5_7b1e0779_for_value_3 *)((long)__return_storage_ptr__ + 8))->s_).
    super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_e0._0_8_;
    *(undefined4 *)((long)((long)__return_storage_ptr__ + 8) + 8) = local_e0._8_4_;
    if ((gc_heap *)local_e0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_e0._0_8_,
                      (gc_heap_ptr_untyped *)
                      &((anon_union_32_5_7b1e0779_for_value_3 *)((long)__return_storage_ptr__ + 8))
                       ->s_);
    }
    this = (json_token *)local_e0;
    goto LAB_0014340e;
  default:
    json_lexer::throw_unexpected(lex,(json_token *)local_140);
  case 7:
    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)lex);
    global_object::make_object((global_object *)local_1a8);
    pgVar3 = (lex->global_).super_gc_heap_ptr_untyped.heap_;
    iVar6 = 0;
    local_1a8._16_8_ = __return_storage_ptr__;
    while( true ) {
      json_lexer::skip_whitespace(lex);
      jVar1 = (lex->tok_).type_;
      if (jVar1 == rbrace) break;
      bVar7 = iVar6 != 0;
      iVar6 = iVar6 + -1;
      if (bVar7) {
        if (jVar1 != comma) goto LAB_00143447;
        json_lexer::next_token(&local_a0,lex);
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_a0.text_._M_dataplus._M_p != &local_a0.text_.field_2) {
          operator_delete(local_a0.text_._M_dataplus._M_p,
                          local_a0.text_.field_2._M_allocated_capacity * 4 + 4);
        }
        json_lexer::skip_whitespace(lex);
      }
      if ((lex->tok_).type_ != string) {
LAB_00143447:
        json_lexer::throw_unexpected(lex);
      }
      local_190._M_allocated_capacity = (size_type)local_180;
      pwVar2 = (lex->tok_).text_._M_dataplus._M_p;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)&local_190,pwVar2,pwVar2 + (lex->tok_).text_._M_string_length);
      json_lexer::next_token((json_token *)local_110,lex);
      if ((gc_heap *)local_110._8_8_ != (gc_heap *)(local_100 + 8)) {
        operator_delete((void *)local_110._8_8_,local_100._8_8_ * 4 + 4);
      }
      json_lexer::skip_whitespace(lex);
      if ((lex->tok_).type_ != colon) {
        json_lexer::throw_unexpected(lex);
      }
      json_lexer::next_token((json_token *)local_e0,lex);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)CONCAT44(local_e0._12_4_,local_e0._8_4_) != &local_c8) {
        operator_delete((gc_heap **)CONCAT44(local_e0._12_4_,local_e0._8_4_),
                        local_c8._M_allocated_capacity * 4 + 4);
      }
      json_lexer::skip_whitespace(lex);
      plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_1a8);
      local_b0._M_len = local_190._8_8_;
      local_b0._M_str = (wchar_t *)local_190._M_allocated_capacity;
      string::string((string *)&local_70,pgVar3,&local_b0);
      json_parse_value((value *)&local_170,lex);
      (**(code **)(*plVar5 + 8))(plVar5,&local_70,&local_170,0);
      value::destroy((value *)&local_170);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_70);
      if ((bool **)local_190._M_allocated_capacity != local_180) {
        operator_delete((void *)local_190._M_allocated_capacity,(long)local_180[0] * 4 + 4);
      }
    }
    json_lexer::next_token(&local_170,lex);
    __return_storage_ptr__ = (value *)local_1a8._16_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_170.text_._M_dataplus._M_p != &local_170.text_.field_2) {
      operator_delete(local_170.text_._M_dataplus._M_p,
                      local_170.text_.field_2._M_allocated_capacity * 4 + 4);
    }
    *&__return_storage_ptr__->type_ = object;
    (((anon_union_32_5_7b1e0779_for_value_3 *)((long)__return_storage_ptr__ + 8))->s_).
    super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_1a8._0_8_;
    *(undefined4 *)((long)((long)__return_storage_ptr__ + 8) + 8) = local_1a8._8_4_;
    this = (json_token *)local_1a8;
    if ((gc_heap *)local_1a8._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_1a8._0_8_,
                      (gc_heap_ptr_untyped *)
                      &((anon_union_32_5_7b1e0779_for_value_3 *)((long)__return_storage_ptr__ + 8))
                       ->s_);
      this = (json_token *)local_1a8;
    }
LAB_0014340e:
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_138._M_p != &local_128) {
    operator_delete(local_138._M_p,local_128._M_allocated_capacity * 4 + 4);
  }
  return __return_storage_ptr__;
}

Assistant:

value json_parse_value(json_lexer& lex) {
    lex.skip_whitespace();
    auto token = lex.current_token();
    lex.next_token();
    switch (token.type()) {
    case json_token_type::string:       return value{string{lex.global().heap(), token.text()}};
    case json_token_type::number:       return value{to_number(token.text())};
    case json_token_type::null:         return value::null;
    case json_token_type::false_:       return value{false};
    case json_token_type::true_:        return value{true};
    case json_token_type::lbracket:     return json_parse_array(lex);
    case json_token_type::lbrace:       return json_parse_object(lex);
    default:
        break;
    }
    lex.throw_unexpected(token);
}